

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_gl.cpp
# Opt level: O1

void __thiscall
FNodeBuilder::AddMinisegs(FNodeBuilder *this,node_t *node,DWORD splitseg,DWORD *fset,DWORD *bset)

{
  FEventTree *this_00;
  FPrivSeg *pFVar1;
  sector_t_conflict *psVar2;
  sector_t_conflict *psVar3;
  DWORD seg1;
  DWORD seg1_00;
  DWORD DVar4;
  DWORD DVar5;
  FEvent *pFVar6;
  FEvent *event;
  FEvent *pFVar7;
  
  this_00 = &this->Events;
  pFVar6 = FEventTree::GetMinimum(this_00);
  if (pFVar6 != (FEvent *)0x0) {
    pFVar7 = (FEvent *)0x0;
    do {
      event = pFVar6;
      if (pFVar7 != (FEvent *)0x0) {
        seg1 = CheckLoopStart(this,node->dx,node->dy,(pFVar7->Info).Vertex,(event->Info).Vertex);
        if (seg1 != 0xffffffff) {
          seg1_00 = CheckLoopStart(this,-node->dx,-node->dy,(event->Info).Vertex,
                                   (pFVar7->Info).Vertex);
          if (seg1_00 != 0xffffffff) {
            DVar4 = CheckLoopEnd(this,node->dx,node->dy,(event->Info).Vertex);
            if (DVar4 != 0xffffffff) {
              DVar4 = CheckLoopEnd(this,-node->dx,-node->dy,(pFVar7->Info).Vertex);
              if (DVar4 != 0xffffffff) {
                DVar4 = AddMiniseg(this,(pFVar7->Info).Vertex,(event->Info).Vertex,0xffffffff,seg1,
                                   splitseg);
                (this->Segs).Array[DVar4].next = *fset;
                *fset = DVar4;
                DVar5 = AddMiniseg(this,(event->Info).Vertex,(pFVar7->Info).Vertex,DVar4,seg1_00,
                                   splitseg);
                pFVar1 = (this->Segs).Array;
                pFVar1[DVar5].next = *bset;
                *bset = DVar5;
                psVar2 = pFVar1[seg1].frontsector;
                psVar3 = pFVar1[seg1_00].frontsector;
                pFVar1[DVar4].frontsector = psVar2;
                pFVar1[DVar4].backsector = psVar3;
                pFVar1[DVar5].frontsector = psVar3;
                pFVar1[DVar5].backsector = psVar2;
              }
            }
          }
        }
      }
      pFVar7 = FEventTree::Successor(this_00,event);
      pFVar6 = (FEvent *)0x0;
      if ((FEventTree *)pFVar7 != this_00) {
        pFVar6 = pFVar7;
      }
      pFVar7 = event;
    } while (pFVar6 != (FEvent *)0x0);
  }
  return;
}

Assistant:

void FNodeBuilder::AddMinisegs (const node_t &node, DWORD splitseg, DWORD &fset, DWORD &bset)
{
	FEvent *event = Events.GetMinimum (), *prev = NULL;

	while (event != NULL)
	{
		if (prev != NULL)
		{
			DWORD fseg1, bseg1, fseg2, bseg2;
			DWORD fnseg, bnseg;

			// Minisegs should only be added when they can create valid loops on both the front and
			// back of the splitter. This means some subsectors could be unclosed if their sectors
			// are unclosed, but at least we won't be needlessly creating subsectors in void space.
			// Unclosed subsectors can be closed trivially once the BSP tree is complete.

			if ((fseg1 = CheckLoopStart (node.dx, node.dy, prev->Info.Vertex, event->Info.Vertex)) != DWORD_MAX &&
				(bseg1 = CheckLoopStart (-node.dx, -node.dy, event->Info.Vertex, prev->Info.Vertex)) != DWORD_MAX &&
				(fseg2 = CheckLoopEnd (node.dx, node.dy, event->Info.Vertex)) != DWORD_MAX &&
				(bseg2 = CheckLoopEnd (-node.dx, -node.dy, prev->Info.Vertex)) != DWORD_MAX)
			{
				// Add miniseg on the front side
				fnseg = AddMiniseg (prev->Info.Vertex, event->Info.Vertex, DWORD_MAX, fseg1, splitseg);
				Segs[fnseg].next = fset;
				fset = fnseg;

				// Add miniseg on the back side
				bnseg = AddMiniseg (event->Info.Vertex, prev->Info.Vertex, fnseg, bseg1, splitseg);
				Segs[bnseg].next = bset;
				bset = bnseg;

				sector_t *fsector, *bsector;

				fsector = Segs[fseg1].frontsector;
				bsector = Segs[bseg1].frontsector;

				Segs[fnseg].frontsector = fsector;
				Segs[fnseg].backsector = bsector;
				Segs[bnseg].frontsector = bsector;
				Segs[bnseg].backsector = fsector;

				// Only print the warning if this might be bad.
				if (fsector != bsector &&
					fsector != Segs[fseg1].backsector &&
					bsector != Segs[bseg1].backsector)
				{
					Warn ("Sectors %d at (%d,%d) and %d at (%d,%d) don't match.\n",
						Segs[fseg1].frontsector,
						Vertices[prev->Info.Vertex].x>>FRACBITS, Vertices[prev->Info.Vertex].y>>FRACBITS,
						Segs[bseg1].frontsector,
						Vertices[event->Info.Vertex].x>>FRACBITS, Vertices[event->Info.Vertex].y>>FRACBITS
						);
				}

				D(Printf (PRINT_LOG, "**Minisegs** %d/%d added %d(%d,%d)->%d(%d,%d)\n", fnseg, bnseg,
					prev->Info.Vertex,
					Vertices[prev->Info.Vertex].x>>16, Vertices[prev->Info.Vertex].y>>16,
					event->Info.Vertex,
					Vertices[event->Info.Vertex].x>>16, Vertices[event->Info.Vertex].y>>16));
			}
		}
		prev = event;
		event = Events.GetSuccessor (event);
	}
}